

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fb101::AutowahState::deviceUpdate(AutowahState *this,ALCdevice *param_2)

{
  float *pfVar1;
  float *__last;
  float *in_RDI;
  anon_struct_136_3_13600e2c *chan;
  anon_struct_136_3_13600e2c *__end1_1;
  anon_struct_136_3_13600e2c *__begin1_1;
  anon_struct_136_3_13600e2c (*__range1_1) [16];
  anon_struct_8_2_378b1db4 *e;
  anon_struct_8_2_378b1db4 *__end1;
  anon_struct_8_2_378b1db4 *__begin1;
  anon_struct_8_2_378b1db4 (*__range1) [1024];
  float *local_40;
  float *local_20;
  
  in_RDI[8] = 1.0;
  in_RDI[9] = 1.0;
  in_RDI[10] = 10.0;
  in_RDI[0xb] = 4.5;
  in_RDI[0xc] = 0.00045;
  in_RDI[0xd] = 0.05;
  in_RDI[0xe] = 0.0;
  for (local_20 = in_RDI + 0xf; local_20 != in_RDI + 0x80f; local_20 = local_20 + 2) {
    *local_20 = 0.0;
    local_20[1] = 0.0;
  }
  pfVar1 = in_RDI + 0xa2f;
  for (local_40 = in_RDI + 0x80f; local_40 != pfVar1; local_40 = local_40 + 0x22) {
    __last = std::begin<float,16ul>((float (*) [16])(local_40 + 2));
    std::end<float,16ul>((float (*) [16])(local_40 + 2));
    std::fill<float*,float>(in_RDI,__last,(float *)0x1c7dfa);
    *local_40 = 0.0;
    local_40[1] = 0.0;
  }
  return;
}

Assistant:

void AutowahState::deviceUpdate(const ALCdevice*)
{
    /* (Re-)initializing parameters and clear the buffers. */

    mAttackRate    = 1.0f;
    mReleaseRate   = 1.0f;
    mResonanceGain = 10.0f;
    mPeakGain      = 4.5f;
    mFreqMinNorm   = 4.5e-4f;
    mBandwidthNorm = 0.05f;
    mEnvDelay      = 0.0f;

    for(auto &e : mEnv)
    {
        e.cos_w0 = 0.0f;
        e.alpha = 0.0f;
    }

    for(auto &chan : mChans)
    {
        std::fill(std::begin(chan.CurrentGains), std::end(chan.CurrentGains), 0.0f);
        chan.Filter.z1 = 0.0f;
        chan.Filter.z2 = 0.0f;
    }
}